

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O3

bool __thiscall
cmExecuteProcessCommand::InitialPass
          (cmExecuteProcessCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pvVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  cmsysProcess *cp;
  long *plVar6;
  pointer pcVar7;
  char *pcVar8;
  ostream *poVar9;
  ulong *puVar10;
  vector<const_char_*,_std::allocator<const_char_*>_> *cmd;
  vector<char_const*,std::allocator<char_const*>> *pvVar11;
  cmMakefile *pcVar12;
  int idx;
  long lVar13;
  pointer pbVar14;
  vector<char,std::allocator<char>> *pvVar15;
  size_t sVar16;
  ulong uVar17;
  cmProcessOutput processOutput;
  string working_directory;
  int length;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  cmds;
  char buf [16];
  vector<char,_std::allocator<char>_> tempError;
  vector<char,_std::allocator<char>_> tempOutput;
  string error_variable;
  string output_variable;
  string output_file;
  char *data;
  double timeout;
  string results_variable;
  string result_variable;
  string strdata;
  string error_file;
  string input_file;
  string timeout_string;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  string arguments;
  cmProcessOutput local_441;
  cmCommand *local_440;
  undefined4 local_434;
  char *local_430;
  long local_428;
  char local_420;
  undefined7 uStack_41f;
  Encoding local_410;
  int local_40c;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  vector<char,_std::allocator<char>_> local_3c8;
  vector<char,_std::allocator<char>_> local_3a8;
  ulong local_388;
  ulong local_380;
  string local_378;
  string local_358;
  string local_338;
  vector<char,_std::allocator<char>_> local_318;
  vector<char,_std::allocator<char>_> local_2f8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  char *local_2d0;
  double local_2c8;
  string local_2c0;
  string local_2a0;
  undefined1 local_280 [112];
  ios_base local_210 [264];
  char *local_108;
  size_t local_100;
  char local_f8;
  undefined7 uStack_f7;
  char *local_e8;
  long local_e0;
  char local_d8;
  undefined7 uStack_d7;
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  string local_70;
  string local_50;
  
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_440 = &this->super_cmCommand;
  if (pbVar14 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_280._0_8_ = local_280 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"called with incorrect number of arguments","");
    cmCommand::SetError(local_440,(string *)local_280);
    if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
      operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
    }
    return false;
  }
  local_408.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = false;
  local_408.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (vector<const_char_*,_std::allocator<const_char_*>_> *)0x0;
  local_90 = &local_80;
  local_88 = 0;
  local_80 = 0;
  local_c8 = &local_b8;
  local_c0 = 0;
  local_b8 = 0;
  local_e8 = &local_d8;
  local_e0 = 0;
  local_d8 = '\0';
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  local_338._M_string_length = 0;
  local_338.field_2._M_local_buf[0] = '\0';
  local_108 = &local_f8;
  local_100 = 0;
  local_f8 = '\0';
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  local_358._M_string_length = 0;
  local_358.field_2._M_local_buf[0] = '\0';
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  local_378._M_string_length = 0;
  local_378.field_2._M_local_buf[0] = '\0';
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  local_2a0._M_string_length = 0;
  local_2a0.field_2._M_local_buf[0] = '\0';
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0._M_string_length = 0;
  local_2c0.field_2._M_local_buf[0] = '\0';
  local_430 = &local_420;
  local_428 = 0;
  local_420 = '\0';
  lVar13 = 0;
  local_380 = 0;
  local_388 = 0;
  local_2d8 = 0;
  uVar17 = 0;
  local_410 = None;
  local_2e0 = 0;
  do {
    iVar3 = std::__cxx11::string::compare((char *)(pbVar14 + uVar17));
    if (iVar3 == 0) {
      lVar13 = ((long)local_408.
                      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_408.
                      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      if (local_408.
          super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_408.
          super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        bVar2 = true;
        std::
        vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
        ::_M_realloc_insert<>
                  (&local_408,
                   (iterator)
                   local_408.
                   super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        ((local_408.
          super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        ((local_408.
          super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ((local_408.
          super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_408.
        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_408.
             super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
LAB_0022a39b:
        bVar2 = true;
      }
    }
    else {
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar17));
      if (iVar3 == 0) {
        uVar17 = uVar17 + 1;
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17) {
          local_280._0_8_ = local_280 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_280," called with no value for OUTPUT_VARIABLE.","");
          cmCommand::SetError(local_440,(string *)local_280);
          goto LAB_0022b3c0;
        }
        std::__cxx11::string::_M_assign((string *)&local_358);
      }
      else {
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar17));
        if (iVar3 == 0) {
          uVar17 = uVar17 + 1;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17) {
            local_280._0_8_ = local_280 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_280," called with no value for ERROR_VARIABLE.","");
            cmCommand::SetError(local_440,(string *)local_280);
            goto LAB_0022b3c0;
          }
          std::__cxx11::string::_M_assign((string *)&local_378);
        }
        else {
          iVar3 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar17));
          if (iVar3 == 0) {
            uVar17 = uVar17 + 1;
            if ((ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17) {
              local_280._0_8_ = local_280 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_280," called with no value for RESULT_VARIABLE.","");
              cmCommand::SetError(local_440,(string *)local_280);
              goto LAB_0022b3c0;
            }
            std::__cxx11::string::_M_assign((string *)&local_2a0);
          }
          else {
            iVar3 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar17));
            if (iVar3 == 0) {
              uVar17 = uVar17 + 1;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17) {
                local_280._0_8_ = local_280 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_280," called with no value for RESULTS_VARIABLE.","");
                cmCommand::SetError(local_440,(string *)local_280);
                goto LAB_0022b3c0;
              }
              std::__cxx11::string::_M_assign((string *)&local_2c0);
            }
            else {
              iVar3 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar17));
              if (iVar3 == 0) {
                uVar17 = uVar17 + 1;
                if ((ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17) {
                  local_280._0_8_ = local_280 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_280," called with no value for WORKING_DIRECTORY.","");
                  cmCommand::SetError(local_440,(string *)local_280);
                  goto LAB_0022b3c0;
                }
                std::__cxx11::string::_M_assign((string *)&local_430);
              }
              else {
                iVar3 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar17));
                if (iVar3 == 0) {
                  uVar17 = uVar17 + 1;
                  if ((ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17) {
                    local_280._0_8_ = local_280 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_280," called with no value for INPUT_FILE.","");
                    cmCommand::SetError(local_440,(string *)local_280);
                    goto LAB_0022b3c0;
                  }
                  std::__cxx11::string::_M_assign((string *)&local_e8);
                }
                else {
                  iVar3 = std::__cxx11::string::compare
                                    ((char *)((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar17));
                  if (iVar3 == 0) {
                    uVar17 = uVar17 + 1;
                    if ((ulong)((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17) {
                      local_280._0_8_ = local_280 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_280," called with no value for OUTPUT_FILE.","");
                      cmCommand::SetError(local_440,(string *)local_280);
                      goto LAB_0022b3c0;
                    }
                    std::__cxx11::string::_M_assign((string *)&local_338);
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare
                                      ((char *)((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start + uVar17)
                                      );
                    if (iVar3 == 0) {
                      uVar17 = uVar17 + 1;
                      if ((ulong)((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17)
                      {
                        local_280._0_8_ = local_280 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_280," called with no value for ERROR_FILE.","");
                        cmCommand::SetError(local_440,(string *)local_280);
                        goto LAB_0022b3c0;
                      }
                      std::__cxx11::string::_M_assign((string *)&local_108);
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare
                                        ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                 uVar17));
                      if (iVar3 == 0) {
                        uVar17 = uVar17 + 1;
                        if ((ulong)((long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17
                           ) {
                          local_280._0_8_ = local_280 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_280," called with no value for TIMEOUT.","");
                          cmCommand::SetError(local_440,(string *)local_280);
                          goto LAB_0022b3c0;
                        }
                        std::__cxx11::string::_M_assign((string *)&local_c8);
                      }
                      else {
                        uVar5 = std::__cxx11::string::compare
                                          ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar17));
                        if ((int)uVar5 == 0) {
                          local_380 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                        }
                        else {
                          uVar5 = std::__cxx11::string::compare
                                            ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar17));
                          if ((int)uVar5 == 0) {
                            local_388 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                          }
                          else {
                            uVar5 = std::__cxx11::string::compare
                                              ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar17));
                            if ((int)uVar5 == 0) {
                              local_2d8 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                            }
                            else {
                              uVar5 = std::__cxx11::string::compare
                                                ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar17));
                              if ((int)uVar5 == 0) {
                                local_2e0 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                              }
                              else {
                                iVar3 = std::__cxx11::string::compare
                                                  ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar17));
                                if (iVar3 != 0) {
                                  if (bVar2) {
                                    local_280._0_8_ =
                                         (args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar17].
                                         _M_dataplus._M_p;
                                    std::vector<char_const*,std::allocator<char_const*>>::
                                    emplace_back<char_const*>
                                              ((vector<char_const*,std::allocator<char_const*>> *)
                                               ((long)local_408.
                                                                                                            
                                                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                               lVar13 * 0x18),(char **)local_280);
                                    goto LAB_0022a39b;
                                  }
                                  std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)local_280);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_280," given unknown argument \"",0x19)
                                  ;
                                  pbVar14 = (args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start;
                                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                                     ((ostream *)local_280,
                                                      pbVar14[uVar17]._M_dataplus._M_p,
                                                      pbVar14[uVar17]._M_string_length);
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\".",2)
                                  ;
                                  std::__cxx11::stringbuf::str();
                                  cmCommand::SetError(local_440,&local_3e8);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                                    operator_delete(local_3e8._M_dataplus._M_p,
                                                    local_3e8.field_2._M_allocated_capacity + 1);
                                  }
                                  std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)local_280);
                                  std::ios_base::~ios_base(local_210);
                                  goto LAB_0022b3dd;
                                }
                                uVar17 = uVar17 + 1;
                                pbVar14 = (args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start;
                                if ((ulong)((long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                            (long)pbVar14 >> 5) <= uVar17) {
                                  local_280._0_8_ = local_280 + 0x10;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)local_280,
                                             " called with no value for ENCODING.","");
                                  cmCommand::SetError(local_440,(string *)local_280);
                                  goto LAB_0022b3c0;
                                }
                                local_410 = cmProcessOutput::FindEncoding(pbVar14 + uVar17);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      bVar2 = false;
    }
    uVar17 = uVar17 + 1;
    pbVar14 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  } while (uVar17 < (ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5))
  ;
  bVar2 = cmMakefile::CanIWriteThisFile(local_440->Makefile,&local_338);
  pvVar1 = local_408.
           super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar2) {
    std::operator+(&local_3e8,"attempted to output into a file: ",&local_338);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_3e8);
    local_280._0_8_ = local_280 + 0x10;
    puVar10 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar10) {
      local_280._16_8_ = *puVar10;
      local_280._24_8_ = plVar6[3];
    }
    else {
      local_280._16_8_ = *puVar10;
      local_280._0_8_ = (ulong *)*plVar6;
    }
    local_280._8_8_ = plVar6[1];
    *plVar6 = (long)puVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    cmCommand::SetError(local_440,(string *)local_280);
    cmSystemTools::s_FatalErrorOccured = true;
LAB_0022b3c0:
    if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
      operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
    }
LAB_0022b3dd:
    bVar2 = false;
    goto LAB_0022b3df;
  }
  if (local_408.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_408.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_280._0_8_ = local_280 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280," called with no COMMAND argument.","");
    cmCommand::SetError(local_440,(string *)local_280);
    goto LAB_0022b3c0;
  }
  pvVar11 = (vector<char_const*,std::allocator<char_const*>> *)
            local_408.
            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (*(long *)pvVar11 == *(long *)(pvVar11 + 8)) {
      local_280._0_8_ = local_280 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_280," given COMMAND argument with no value.","");
      cmCommand::SetError(local_440,(string *)local_280);
      goto LAB_0022b3c0;
    }
    local_280._0_8_ = (char *)0x0;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              (pvVar11,(char **)local_280);
    pvVar11 = pvVar11 + 0x18;
  } while (pvVar11 != (vector<char_const*,std::allocator<char_const*>> *)pvVar1);
  local_2c8 = -1.0;
  if ((local_c0 != 0) && (iVar3 = __isoc99_sscanf(local_c8,"%lg",&local_2c8), iVar3 != 1)) {
    local_280._0_8_ = local_280 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280," called with TIMEOUT value that could not be parsed.","");
    cmCommand::SetError(local_440,(string *)local_280);
    goto LAB_0022b3c0;
  }
  cp = cmsysProcess_New();
  pvVar1 = local_408.
           super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar11 = (vector<char_const*,std::allocator<char_const*>> *)
                 local_408.
                 super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pvVar11 != (vector<char_const*,std::allocator<char_const*>> *)pvVar1; pvVar11 = pvVar11 + 0x18
      ) {
    cmsysProcess_AddCommand(cp,*(char ***)pvVar11);
  }
  if (local_428 != 0) {
    cmsysProcess_SetWorkingDirectory(cp,local_430);
  }
  cmsysProcess_SetOption(cp,0,1);
  if (local_e0 != 0) {
    cmsysProcess_SetPipeFile(cp,1,local_e8);
  }
  if (local_338._M_string_length != 0) {
    cmsysProcess_SetPipeFile(cp,2,local_338._M_dataplus._M_p);
  }
  pcVar8 = local_108;
  if (local_100 == 0) {
LAB_0022a9a3:
    local_434 = 0;
    if ((local_358._M_string_length != 0) &&
       (local_358._M_string_length == local_378._M_string_length)) {
LAB_0022a9ca:
      uVar4 = bcmp(local_358._M_dataplus._M_p,local_378._M_dataplus._M_p,local_358._M_string_length)
      ;
      uVar17 = (ulong)uVar4;
      if (((char)local_434 != '\0') || (uVar4 == 0)) goto LAB_0022ab94;
      local_434 = 0;
    }
  }
  else {
    if (local_100 != local_338._M_string_length) {
LAB_0022a993:
      cmsysProcess_SetPipeFile(cp,3,pcVar8);
      goto LAB_0022a9a3;
    }
    uVar4 = bcmp(local_108,local_338._M_dataplus._M_p,local_100);
    uVar17 = (ulong)uVar4;
    if (uVar4 != 0) goto LAB_0022a993;
    if (local_358._M_string_length != 0) {
      uVar17 = 0;
      local_434 = 1;
      if (local_358._M_string_length != local_378._M_string_length) goto LAB_0022ab94;
      goto LAB_0022a9ca;
    }
LAB_0022ab94:
    local_434 = (undefined4)CONCAT71((int7)(uVar17 >> 8),1);
    cmsysProcess_SetOption(cp,2,1);
  }
  if (0.0 <= local_2c8) {
    cmsysProcess_SetTimeout(cp,local_2c8);
  }
  cmsysProcess_Execute(cp);
  local_3a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_3a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (char *)0x0;
  local_3a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (char *)0x0;
  cmProcessOutput::cmProcessOutput(&local_441,local_410,0x400);
  local_280._0_8_ = local_280 + 0x10;
  local_280._8_8_ = 0;
  local_280._16_8_ = local_280._16_8_ & 0xffffffffffffff00;
LAB_0022ac43:
  do {
    while (iVar3 = cmsysProcess_WaitForData(cp,&local_2d0,&local_40c,(double *)0x0), iVar3 == 2) {
      if ((local_380 & 1) == 0) {
        if (local_358._M_string_length == 0) {
          cmProcessOutput::DecodeText(&local_441,local_2d0,(long)local_40c,(string *)local_280,1);
          cmSystemTools::Stdout((string *)local_280);
        }
        else {
          pvVar15 = (vector<char,std::allocator<char>> *)&local_3a8;
LAB_0022acb5:
          std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
                    (pvVar15,*(undefined8 *)(pvVar15 + 8));
        }
      }
    }
    if (iVar3 == 3) {
      if ((local_388 & 1) == 0) {
        pvVar15 = (vector<char,std::allocator<char>> *)&local_3c8;
        if (local_378._M_string_length != 0) goto LAB_0022acb5;
        cmProcessOutput::DecodeText(&local_441,local_2d0,(long)local_40c,(string *)local_280,2);
        cmSystemTools::Stderr((string *)local_280);
      }
      goto LAB_0022ac43;
    }
  } while (iVar3 != 0);
  if (((local_380 & 1) == 0) && (local_358._M_string_length == 0)) {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    cmProcessOutput::DecodeText(&local_441,&local_50,(string *)local_280,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if (local_280._8_8_ != 0) {
      cmSystemTools::Stdout((string *)local_280);
    }
  }
  if (((local_388 & 1) == 0) && (local_378._M_string_length == 0)) {
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    cmProcessOutput::DecodeText(&local_441,&local_70,(string *)local_280,2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if (local_280._8_8_ != 0) {
      cmSystemTools::Stderr((string *)local_280);
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar17 = (long)local_3a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_3a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar17 == 0) {
    pcVar7 = (pointer)0x0;
    sVar16 = 0;
  }
  else {
    if ((long)uVar17 < 0) goto LAB_0022b659;
    pcVar7 = (pointer)operator_new(uVar17);
    sVar16 = (long)local_3a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_3a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  }
  local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pcVar7 + uVar17;
  local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = pcVar7;
  if (local_3a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_3a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar7;
    memmove(pcVar7,local_3a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar16);
  }
  local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar7 + sVar16;
  cmProcessOutput::DecodeText(&local_441,&local_2f8,&local_3a8,0);
  if (local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar17 = (long)local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar17 == 0) {
    pcVar7 = (pointer)0x0;
    sVar16 = 0;
  }
  else {
    if ((long)uVar17 < 0) {
LAB_0022b659:
      std::__throw_bad_alloc();
    }
    pcVar7 = (pointer)operator_new(uVar17);
    sVar16 = (long)local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  }
  local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pcVar7 + uVar17;
  local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = pcVar7;
  if (local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar7;
    memmove(pcVar7,local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar16);
  }
  local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar7 + sVar16;
  cmProcessOutput::DecodeText(&local_441,&local_318,&local_3c8,0);
  if (local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cmExecuteProcessCommandFixText(&local_3a8,(bool)((byte)local_2d8 & 1));
  cmExecuteProcessCommandFixText(&local_3c8,(bool)((byte)local_2e0 & 1));
  if ((local_358._M_string_length != 0) &&
     (local_3a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_3a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    cmMakefile::AddDefinition
              (local_440->Makefile,&local_358,
               local_3a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if (((char)local_434 == '\0' && local_378._M_string_length != 0) &&
     (local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    cmMakefile::AddDefinition
              (local_440->Makefile,&local_378,
               local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if (local_2a0._M_string_length == 0) goto switchD_0022b086_caseD_3;
  iVar3 = cmsysProcess_GetState(cp);
  switch(iVar3) {
  case 1:
    pcVar12 = local_440->Makefile;
    pcVar8 = cmsysProcess_GetErrorString(cp);
    goto LAB_0022b0e7;
  case 2:
    pcVar12 = local_440->Makefile;
    pcVar8 = cmsysProcess_GetExceptionString(cp);
LAB_0022b0e7:
    cmMakefile::AddDefinition(pcVar12,&local_2a0,pcVar8);
    break;
  case 4:
    uVar4 = cmsysProcess_GetExitValue(cp);
    sprintf((char *)&local_3e8,"%d",(ulong)uVar4);
    cmMakefile::AddDefinition(local_440->Makefile,&local_2a0,(char *)&local_3e8);
    break;
  case 5:
    cmMakefile::AddDefinition(local_440->Makefile,&local_2a0,"Process terminated due to timeout");
  }
switchD_0022b086_caseD_3:
  if (local_2c0._M_string_length == 0) goto switchD_0022b149_caseD_3;
  iVar3 = cmsysProcess_GetState(cp);
  switch(iVar3) {
  case 1:
    pcVar12 = local_440->Makefile;
    pcVar8 = cmsysProcess_GetErrorString(cp);
    goto LAB_0022b2a2;
  case 2:
    pcVar12 = local_440->Makefile;
    pcVar8 = cmsysProcess_GetExceptionString(cp);
LAB_0022b2a2:
    cmMakefile::AddDefinition(pcVar12,&local_2c0,pcVar8);
    break;
  case 4:
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_408.
        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_408.
        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar17 = 0;
      do {
        idx = (int)uVar17;
        iVar3 = cmsysProcess_GetStateByIndex(cp,idx);
        if (iVar3 == 2) {
          local_3e8._M_dataplus._M_p = cmsysProcess_GetExceptionStringByIndex(cp,idx);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                     (char **)&local_3e8);
        }
        else if (iVar3 == 4) {
          uVar4 = cmsysProcess_GetExitValueByIndex(cp,idx);
          sprintf((char *)&local_3e8,"%d",(ulong)uVar4);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char(&)[16]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                     (char (*) [16])&local_3e8);
        }
        else {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[36]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                     (char (*) [36])"Error getting the child return code");
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < (ulong)(((long)local_408.
                                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_408.
                                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    pcVar12 = local_440->Makefile;
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_3e8,&local_a8,";");
    cmMakefile::AddDefinition(pcVar12,&local_2c0,local_3e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
    break;
  case 5:
    cmMakefile::AddDefinition(local_440->Makefile,&local_2c0,"Process terminated due to timeout");
  }
switchD_0022b149_caseD_3:
  cmsysProcess_Delete(cp);
  if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_441);
  if (local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_3a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  bVar2 = true;
LAB_0022b3df:
  if (local_430 != &local_420) {
    operator_delete(local_430,CONCAT71(uStack_41f,local_420) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,
                    CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                             local_2c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,
                    CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                             local_2a0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,
                    CONCAT71(local_378.field_2._M_allocated_capacity._1_7_,
                             local_378.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,
                    CONCAT71(local_358.field_2._M_allocated_capacity._1_7_,
                             local_358.field_2._M_local_buf[0]) + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,
                    CONCAT71(local_338.field_2._M_allocated_capacity._1_7_,
                             local_338.field_2._M_local_buf[0]) + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::~vector(&local_408);
  return bVar2;
}

Assistant:

bool cmExecuteProcessCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::vector<const char*>> cmds;
  std::string arguments;
  bool doing_command = false;
  size_t command_index = 0;
  bool output_quiet = false;
  bool error_quiet = false;
  bool output_strip_trailing_whitespace = false;
  bool error_strip_trailing_whitespace = false;
  std::string timeout_string;
  std::string input_file;
  std::string output_file;
  std::string error_file;
  std::string output_variable;
  std::string error_variable;
  std::string result_variable;
  std::string results_variable;
  std::string working_directory;
  cmProcessOutput::Encoding encoding = cmProcessOutput::None;
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "COMMAND") {
      doing_command = true;
      command_index = cmds.size();
      cmds.emplace_back();
    } else if (args[i] == "OUTPUT_VARIABLE") {
      doing_command = false;
      if (++i < args.size()) {
        output_variable = args[i];
      } else {
        this->SetError(" called with no value for OUTPUT_VARIABLE.");
        return false;
      }
    } else if (args[i] == "ERROR_VARIABLE") {
      doing_command = false;
      if (++i < args.size()) {
        error_variable = args[i];
      } else {
        this->SetError(" called with no value for ERROR_VARIABLE.");
        return false;
      }
    } else if (args[i] == "RESULT_VARIABLE") {
      doing_command = false;
      if (++i < args.size()) {
        result_variable = args[i];
      } else {
        this->SetError(" called with no value for RESULT_VARIABLE.");
        return false;
      }
    } else if (args[i] == "RESULTS_VARIABLE") {
      doing_command = false;
      if (++i < args.size()) {
        results_variable = args[i];
      } else {
        this->SetError(" called with no value for RESULTS_VARIABLE.");
        return false;
      }
    } else if (args[i] == "WORKING_DIRECTORY") {
      doing_command = false;
      if (++i < args.size()) {
        working_directory = args[i];
      } else {
        this->SetError(" called with no value for WORKING_DIRECTORY.");
        return false;
      }
    } else if (args[i] == "INPUT_FILE") {
      doing_command = false;
      if (++i < args.size()) {
        input_file = args[i];
      } else {
        this->SetError(" called with no value for INPUT_FILE.");
        return false;
      }
    } else if (args[i] == "OUTPUT_FILE") {
      doing_command = false;
      if (++i < args.size()) {
        output_file = args[i];
      } else {
        this->SetError(" called with no value for OUTPUT_FILE.");
        return false;
      }
    } else if (args[i] == "ERROR_FILE") {
      doing_command = false;
      if (++i < args.size()) {
        error_file = args[i];
      } else {
        this->SetError(" called with no value for ERROR_FILE.");
        return false;
      }
    } else if (args[i] == "TIMEOUT") {
      doing_command = false;
      if (++i < args.size()) {
        timeout_string = args[i];
      } else {
        this->SetError(" called with no value for TIMEOUT.");
        return false;
      }
    } else if (args[i] == "OUTPUT_QUIET") {
      doing_command = false;
      output_quiet = true;
    } else if (args[i] == "ERROR_QUIET") {
      doing_command = false;
      error_quiet = true;
    } else if (args[i] == "OUTPUT_STRIP_TRAILING_WHITESPACE") {
      doing_command = false;
      output_strip_trailing_whitespace = true;
    } else if (args[i] == "ERROR_STRIP_TRAILING_WHITESPACE") {
      doing_command = false;
      error_strip_trailing_whitespace = true;
    } else if (args[i] == "ENCODING") {
      doing_command = false;
      if (++i < args.size()) {
        encoding = cmProcessOutput::FindEncoding(args[i]);
      } else {
        this->SetError(" called with no value for ENCODING.");
        return false;
      }
    } else if (doing_command) {
      cmds[command_index].push_back(args[i].c_str());
    } else {
      std::ostringstream e;
      e << " given unknown argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
    }
  }

  if (!this->Makefile->CanIWriteThisFile(output_file)) {
    std::string e = "attempted to output into a file: " + output_file +
      " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  // Check for commands given.
  if (cmds.empty()) {
    this->SetError(" called with no COMMAND argument.");
    return false;
  }
  for (auto& cmd : cmds) {
    if (cmd.empty()) {
      this->SetError(" given COMMAND argument with no value.");
      return false;
    }
    // Add the null terminating pointer to the command argument list.
    cmd.push_back(nullptr);
  }

  // Parse the timeout string.
  double timeout = -1;
  if (!timeout_string.empty()) {
    if (sscanf(timeout_string.c_str(), "%lg", &timeout) != 1) {
      this->SetError(" called with TIMEOUT value that could not be parsed.");
      return false;
    }
  }

  // Create a process instance.
  cmsysProcess* cp = cmsysProcess_New();

  // Set the command sequence.
  for (auto const& cmd : cmds) {
    cmsysProcess_AddCommand(cp, cmd.data());
  }

  // Set the process working directory.
  if (!working_directory.empty()) {
    cmsysProcess_SetWorkingDirectory(cp, working_directory.c_str());
  }

  // Always hide the process window.
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);

  // Check the output variables.
  bool merge_output = false;
  if (!input_file.empty()) {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDIN, input_file.c_str());
  }
  if (!output_file.empty()) {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDOUT,
                             output_file.c_str());
  }
  if (!error_file.empty()) {
    if (error_file == output_file) {
      merge_output = true;
    } else {
      cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDERR,
                               error_file.c_str());
    }
  }
  if (!output_variable.empty() && output_variable == error_variable) {
    merge_output = true;
  }
  if (merge_output) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
  }

  // Set the timeout if any.
  if (timeout >= 0) {
    cmsysProcess_SetTimeout(cp, timeout);
  }

  // Start the process.
  cmsysProcess_Execute(cp);

  // Read the process output.
  std::vector<char> tempOutput;
  std::vector<char> tempError;
  int length;
  char* data;
  int p;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while ((p = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    // Put the output in the right place.
    if (p == cmsysProcess_Pipe_STDOUT && !output_quiet) {
      if (output_variable.empty()) {
        processOutput.DecodeText(data, length, strdata, 1);
        cmSystemTools::Stdout(strdata);
      } else {
        cmExecuteProcessCommandAppend(tempOutput, data, length);
      }
    } else if (p == cmsysProcess_Pipe_STDERR && !error_quiet) {
      if (error_variable.empty()) {
        processOutput.DecodeText(data, length, strdata, 2);
        cmSystemTools::Stderr(strdata);
      } else {
        cmExecuteProcessCommandAppend(tempError, data, length);
      }
    }
  }
  if (!output_quiet && output_variable.empty()) {
    processOutput.DecodeText(std::string(), strdata, 1);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }
  if (!error_quiet && error_variable.empty()) {
    processOutput.DecodeText(std::string(), strdata, 2);
    if (!strdata.empty()) {
      cmSystemTools::Stderr(strdata);
    }
  }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(tempOutput, tempOutput);
  processOutput.DecodeText(tempError, tempError);

  // Fix the text in the output strings.
  cmExecuteProcessCommandFixText(tempOutput, output_strip_trailing_whitespace);
  cmExecuteProcessCommandFixText(tempError, error_strip_trailing_whitespace);

  // Store the output obtained.
  if (!output_variable.empty() && !tempOutput.empty()) {
    this->Makefile->AddDefinition(output_variable, tempOutput.data());
  }
  if (!merge_output && !error_variable.empty() && !tempError.empty()) {
    this->Makefile->AddDefinition(error_variable, tempError.data());
  }

  // Store the result of running the process.
  if (!result_variable.empty()) {
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        int v = cmsysProcess_GetExitValue(cp);
        char buf[16];
        sprintf(buf, "%d", v);
        this->Makefile->AddDefinition(result_variable, buf);
      } break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(result_variable,
                                      cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(result_variable,
                                      cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(result_variable,
                                      "Process terminated due to timeout");
        break;
    }
  }
  // Store the result of running the processes.
  if (!results_variable.empty()) {
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        std::vector<std::string> res;
        for (size_t i = 0; i < cmds.size(); ++i) {
          switch (cmsysProcess_GetStateByIndex(cp, static_cast<int>(i))) {
            case kwsysProcess_StateByIndex_Exited: {
              int exitCode =
                cmsysProcess_GetExitValueByIndex(cp, static_cast<int>(i));
              char buf[16];
              sprintf(buf, "%d", exitCode);
              res.emplace_back(buf);
            } break;
            case kwsysProcess_StateByIndex_Exception:
              res.emplace_back(cmsysProcess_GetExceptionStringByIndex(
                cp, static_cast<int>(i)));
              break;
            case kwsysProcess_StateByIndex_Error:
            default:
              res.emplace_back("Error getting the child return code");
              break;
          }
        }
        this->Makefile->AddDefinition(results_variable,
                                      cmJoin(res, ";").c_str());
      } break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(results_variable,
                                      cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(results_variable,
                                      cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(results_variable,
                                      "Process terminated due to timeout");
        break;
    }
  }

  // Delete the process instance.
  cmsysProcess_Delete(cp);

  return true;
}